

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O2

Gia_Man_t * Shr_ManFree(Shr_Man_t *p)

{
  Gia_Man_t **p_00;
  Gia_Man_t *pGVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Gia_Man_t *p_01;
  Vec_Int_t *__ptr;
  
  p_00 = &p->pNew;
  Gia_ManHashStop(p->pNew);
  pGVar1 = p->pNew;
  __ptr = pGVar1->vLevels;
  if (__ptr != (Vec_Int_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      pGVar1->vLevels->pArray = (int *)0x0;
      __ptr = pGVar1->vLevels;
      if (__ptr == (Vec_Int_t *)0x0) goto LAB_005c23ba;
    }
    free(__ptr);
    pGVar1->vLevels = (Vec_Int_t *)0x0;
  }
LAB_005c23ba:
  iVar2 = Gia_ManHasDangling(*p_00);
  if (iVar2 != 0) {
    pGVar1 = *p_00;
    p_01 = Gia_ManCleanup(pGVar1);
    *p_00 = p_01;
    uVar3 = Gia_ManAndNum(p_01);
    uVar4 = Gia_ManAndNum(pGVar1);
    if (uVar3 != uVar4) {
      printf("Node reduction after sweep %6d -> %6d.\n",(ulong)uVar4,(ulong)uVar3);
    }
    Gia_ManStop(pGVar1);
  }
  Gia_ManSetRegNum(p->pNew,p->pGia->nRegs);
  pGVar1 = p->pNew;
  p->pNew = (Gia_Man_t *)0x0;
  Rsb_ManFree(p->pManRsb);
  Bdc_ManFree(p->pManDec);
  Gia_ManStopP(p_00);
  Vec_WrdFree(p->vFanMem);
  Vec_IntFree(p->vObj2Fan);
  Vec_IntFree(p->vDivs);
  Vec_IntFree(p->vPrio);
  Vec_WrdFree(p->vTruths);
  Vec_WrdFree(p->vDivTruths);
  Vec_IntFree(p->vDivResub);
  Vec_IntFree(p->vLeaves);
  free(p);
  return pGVar1;
}

Assistant:

Gia_Man_t * Shr_ManFree( Shr_Man_t * p )
{
    // prepare the manager
    Gia_Man_t * pTemp;
    Gia_ManHashStop( p->pNew );
    Vec_IntFreeP( &p->pNew->vLevels );
    if ( Gia_ManHasDangling(p->pNew) )
    {
        p->pNew = Gia_ManCleanup( pTemp = p->pNew );
        if ( Gia_ManAndNum(p->pNew) != Gia_ManAndNum(pTemp) )
            printf( "Node reduction after sweep %6d -> %6d.\n", Gia_ManAndNum(pTemp), Gia_ManAndNum(p->pNew) );
        Gia_ManStop( pTemp );
    }
    Gia_ManSetRegNum( p->pNew, Gia_ManRegNum(p->pGia) );
    pTemp = p->pNew; p->pNew = NULL;
    // free data structures
    Rsb_ManFree( p->pManRsb );
    Bdc_ManFree( p->pManDec );
    Gia_ManStopP( &p->pNew );
    Vec_WrdFree( p->vFanMem );
    Vec_IntFree( p->vObj2Fan );
    Vec_IntFree( p->vDivs );
    Vec_IntFree( p->vPrio );
    Vec_WrdFree( p->vTruths );
    Vec_WrdFree( p->vDivTruths );
    Vec_IntFree( p->vDivResub );
    Vec_IntFree( p->vLeaves );
    ABC_FREE( p );
    return pTemp;
}